

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compressContinue_internal
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,U32 frame,
                 U32 lastFrameChunk)

{
  uint uVar1;
  U32 UVar2;
  ZSTD_matchState_t *ms_00;
  ZSTD_CCtx *local_70;
  size_t err_code_1;
  size_t cSize;
  size_t err_code;
  size_t fhSize;
  ZSTD_matchState_t *ms;
  U32 frame_local;
  size_t srcSize_local;
  void *src_local;
  size_t dstCapacity_local;
  void *dst_local;
  ZSTD_CCtx *cctx_local;
  
  ms_00 = &(cctx->blockState).matchState;
  err_code = 0;
  if (cctx->stage == ZSTDcs_created) {
    cctx_local = (ZSTD_CCtx *)0xffffffffffffffc4;
  }
  else {
    src_local = (void *)dstCapacity;
    dstCapacity_local = (size_t)dst;
    if ((frame != 0) && (cctx->stage == ZSTDcs_init)) {
      err_code = ZSTD_writeFrameHeader
                           (dst,dstCapacity,&cctx->appliedParams,cctx->pledgedSrcSizePlusOne - 1,
                            cctx->dictID);
      uVar1 = ERR_isError(err_code);
      if (uVar1 != 0) {
        return err_code;
      }
      if (dstCapacity < err_code) {
        __assert_fail("fhSize <= dstCapacity",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0x11ed,
                      "size_t ZSTD_compressContinue_internal(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32, U32)"
                     );
      }
      src_local = (void *)(dstCapacity - err_code);
      dstCapacity_local = (long)dst + err_code;
      cctx->stage = ZSTDcs_ongoing;
    }
    if (srcSize == 0) {
      cctx_local = (ZSTD_CCtx *)err_code;
    }
    else {
      UVar2 = ZSTD_window_update(&ms_00->window,src,srcSize,
                                 (cctx->blockState).matchState.forceNonContiguous);
      if (UVar2 == 0) {
        (cctx->blockState).matchState.forceNonContiguous = 0;
        (cctx->blockState).matchState.nextToUpdate = (cctx->blockState).matchState.window.dictLimit;
      }
      if ((cctx->appliedParams).ldmParams.enableLdm == ZSTD_ps_enable) {
        ZSTD_window_update(&(cctx->ldmState).window,src,srcSize,0);
      }
      if (frame == 0) {
        ZSTD_overflowCorrectIfNeeded
                  (ms_00,&cctx->workspace,&cctx->appliedParams,src,(void *)((long)src + srcSize));
        local_70 = (ZSTD_CCtx *)
                   ZSTD_compressBlock_internal
                             (cctx,(void *)dstCapacity_local,(size_t)src_local,src,srcSize,0);
      }
      else {
        local_70 = (ZSTD_CCtx *)
                   ZSTD_compress_frameChunk
                             (cctx,(void *)dstCapacity_local,(size_t)src_local,src,srcSize,
                              lastFrameChunk);
      }
      uVar1 = ERR_isError((size_t)local_70);
      if (uVar1 == 0) {
        cctx->consumedSrcSize = srcSize + cctx->consumedSrcSize;
        cctx->producedCSize = (long)&local_70->stage + cctx->producedCSize + err_code;
        if (((cctx->appliedParams).fParams.contentSizeFlag != 0) &&
           (cctx->pledgedSrcSizePlusOne == 0)) {
          __assert_fail("!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                        ,0x120b,
                        "size_t ZSTD_compressContinue_internal(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32, U32)"
                       );
        }
        if ((cctx->pledgedSrcSizePlusOne == 0) ||
           (cctx->consumedSrcSize + 1 <= cctx->pledgedSrcSizePlusOne)) {
          cctx_local = (ZSTD_CCtx *)((long)&local_70->stage + err_code);
        }
        else {
          cctx_local = (ZSTD_CCtx *)0xffffffffffffffb8;
        }
      }
      else {
        cctx_local = local_70;
      }
    }
  }
  return (size_t)cctx_local;
}

Assistant:

static size_t ZSTD_compressContinue_internal (ZSTD_CCtx* cctx,
                              void* dst, size_t dstCapacity,
                        const void* src, size_t srcSize,
                               U32 frame, U32 lastFrameChunk)
{
    ZSTD_matchState_t* const ms = &cctx->blockState.matchState;
    size_t fhSize = 0;

    DEBUGLOG(5, "ZSTD_compressContinue_internal, stage: %u, srcSize: %u",
                cctx->stage, (unsigned)srcSize);
    RETURN_ERROR_IF(cctx->stage==ZSTDcs_created, stage_wrong,
                    "missing init (ZSTD_compressBegin)");

    if (frame && (cctx->stage==ZSTDcs_init)) {
        fhSize = ZSTD_writeFrameHeader(dst, dstCapacity, &cctx->appliedParams,
                                       cctx->pledgedSrcSizePlusOne-1, cctx->dictID);
        FORWARD_IF_ERROR(fhSize, "ZSTD_writeFrameHeader failed");
        assert(fhSize <= dstCapacity);
        dstCapacity -= fhSize;
        dst = (char*)dst + fhSize;
        cctx->stage = ZSTDcs_ongoing;
    }

    if (!srcSize) return fhSize;  /* do not generate an empty block if no input */

    if (!ZSTD_window_update(&ms->window, src, srcSize, ms->forceNonContiguous)) {
        ms->forceNonContiguous = 0;
        ms->nextToUpdate = ms->window.dictLimit;
    }
    if (cctx->appliedParams.ldmParams.enableLdm == ZSTD_ps_enable) {
        ZSTD_window_update(&cctx->ldmState.window, src, srcSize, /* forceNonContiguous */ 0);
    }

    if (!frame) {
        /* overflow check and correction for block mode */
        ZSTD_overflowCorrectIfNeeded(
            ms, &cctx->workspace, &cctx->appliedParams,
            src, (BYTE const*)src + srcSize);
    }

    DEBUGLOG(5, "ZSTD_compressContinue_internal (blockSize=%u)", (unsigned)cctx->blockSize);
    {   size_t const cSize = frame ?
                             ZSTD_compress_frameChunk (cctx, dst, dstCapacity, src, srcSize, lastFrameChunk) :
                             ZSTD_compressBlock_internal (cctx, dst, dstCapacity, src, srcSize, 0 /* frame */);
        FORWARD_IF_ERROR(cSize, "%s", frame ? "ZSTD_compress_frameChunk failed" : "ZSTD_compressBlock_internal failed");
        cctx->consumedSrcSize += srcSize;
        cctx->producedCSize += (cSize + fhSize);
        assert(!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0));
        if (cctx->pledgedSrcSizePlusOne != 0) {  /* control src size */
            ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN == (unsigned long long)-1);
            RETURN_ERROR_IF(
                cctx->consumedSrcSize+1 > cctx->pledgedSrcSizePlusOne,
                srcSize_wrong,
                "error : pledgedSrcSize = %u, while realSrcSize >= %u",
                (unsigned)cctx->pledgedSrcSizePlusOne-1,
                (unsigned)cctx->consumedSrcSize);
        }
        return cSize + fhSize;
    }
}